

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

undefined8 __thiscall
rest_rpc::rpc_client::call<5000ul,std::__cxx11::string,person>
          (rpc_client *this,string *rpc_name,person *args)

{
  out_of_range *this_00;
  undefined8 in_RDI;
  person *in_stack_00000018;
  string *in_stack_00000020;
  rpc_client *in_stack_00000028;
  future_status status;
  future_result<rest_rpc::req_result> future_result;
  future_result<rest_rpc::req_result> *in_stack_ffffffffffffff58;
  future_result<rest_rpc::req_result> *in_stack_ffffffffffffff60;
  unsigned_long local_50;
  duration<long,std::ratio<1l,1000l>> local_48 [12];
  future_status local_3c;
  req_result *in_stack_ffffffffffffffd8;
  
  async_call<(rest_rpc::CallModel)0,person>(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  local_50 = 5000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>(local_48,&local_50)
  ;
  local_3c = future_result<rest_rpc::req_result>::wait_for<long,std::ratio<1l,1000l>>
                       (in_stack_ffffffffffffff60,
                        (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff58);
  if ((local_3c != timeout) && (local_3c != deferred)) {
    future_result<rest_rpc::req_result>::get(in_stack_ffffffffffffff58);
    req_result::as<std::__cxx11::string>(in_stack_ffffffffffffffd8);
    req_result::~req_result((req_result *)0x1f6891);
    future_result<rest_rpc::req_result>::~future_result
              ((future_result<rest_rpc::req_result> *)0x1f689b);
    return in_RDI;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"timeout or deferred");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

typename std::enable_if<!std::is_void<T>::value, T>::type
  call(const std::string &rpc_name, Args &&...args) {
    auto future_result =
        async_call<FUTURE>(rpc_name, std::forward<Args>(args)...);
    auto status = future_result.wait_for(std::chrono::milliseconds(TIMEOUT));
    if (status == std::future_status::timeout ||
        status == std::future_status::deferred) {
      throw std::out_of_range("timeout or deferred");
    }

    return future_result.get().template as<T>();
  }